

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCtxtReadFile(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  char *val_00;
  char *val_01;
  xmlDocPtr val_02;
  int local_4c;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_filename;
  char *filename;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (filename._4_4_ = 0; (int)filename._4_4_ < 3; filename._4_4_ = filename._4_4_ + 1) {
    for (encoding._4_4_ = 0; (int)encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
      for (n_options = 0; n_options < 4; n_options = n_options + 1) {
        for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlParserCtxtPtr(filename._4_4_,0);
          val_00 = gen_filepath(encoding._4_4_,1);
          val_01 = gen_const_char_ptr(n_options,2);
          iVar2 = gen_parseroptions(local_4c,3);
          val_02 = (xmlDocPtr)xmlCtxtReadFile(val,val_00,val_01,iVar2);
          desret_xmlDocPtr(val_02);
          call_tests = call_tests + 1;
          des_xmlParserCtxtPtr(filename._4_4_,val,0);
          des_filepath(encoding._4_4_,val_00,1);
          des_const_char_ptr(n_options,val_01,2);
          des_parseroptions(local_4c,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCtxtReadFile",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)filename._4_4_);
            printf(" %d",(ulong)encoding._4_4_);
            printf(" %d",(ulong)(uint)n_options);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCtxtReadFile(void) {
    int test_ret = 0;

    int mem_base;
    xmlDocPtr ret_val;
    xmlParserCtxtPtr ctxt; /* an XML parser context */
    int n_ctxt;
    const char * filename; /* a file or URL */
    int n_filename;
    char * encoding; /* the document encoding, or NULL */
    int n_encoding;
    int options; /* a combination of xmlParserOption */
    int n_options;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_parseroptions;n_options++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        filename = gen_filepath(n_filename, 1);
        encoding = gen_const_char_ptr(n_encoding, 2);
        options = gen_parseroptions(n_options, 3);

        ret_val = xmlCtxtReadFile(ctxt, filename, (const char *)encoding, options);
        desret_xmlDocPtr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_filepath(n_filename, filename, 1);
        des_const_char_ptr(n_encoding, (const char *)encoding, 2);
        des_parseroptions(n_options, options, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCtxtReadFile",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_filename);
            printf(" %d", n_encoding);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}